

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  uint uVar1;
  long in_RSI;
  ZSTD_CCtx *in_RDI;
  void *in_R8;
  unsigned_long_long in_R9;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  ZSTD_CCtx *in_stack_ffffffffffffffa8;
  ZSTD_CCtx *in_stack_ffffffffffffffb0;
  size_t local_8;
  
  local_8 = ZSTD_CCtx_reset(in_stack_ffffffffffffffa8,0);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_CCtx_setPledgedSrcSize(in_RDI,in_R9);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      memcpy(&in_RDI->requestedParams,in_R8,0xd8);
      if (in_RSI == 0) {
        local_8 = ZSTD_CCtx_refCDict(in_stack_ffffffffffffffa8,(ZSTD_CDict *)0x27e7c5b);
        uVar1 = ERR_isError(local_8);
      }
      else {
        local_8 = ZSTD_CCtx_loadDictionary
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x27e7c16);
        uVar1 = ERR_isError(local_8);
      }
      if (uVar1 == 0) {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}